

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

void store_host_key(char *hostname,int port,char *keytype,char *key)

{
  int iVar1;
  char *__filename;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  char *errmsg;
  char *dir;
  char *tmpfilename;
  char *filename;
  int headerlen;
  char *line;
  char *newtext;
  FILE *wfp;
  FILE *rfp;
  char *key_local;
  char *keytype_local;
  int port_local;
  char *hostname_local;
  
  __filename = make_filename(2,(char *)0x0);
  newtext = (char *)fopen(__filename,"w");
  if (((FILE *)newtext == (FILE *)0x0) && (piVar2 = __errno_location(), *piVar2 == 2)) {
    pcVar3 = make_filename(0,(char *)0x0);
    pcVar4 = make_dir_path(pcVar3,0x1c0);
    if (pcVar4 != (char *)0x0) {
      nonfatal("Unable to store host key: %s",pcVar4);
      safefree(pcVar4);
      safefree(pcVar3);
      safefree(__filename);
      return;
    }
    safefree(pcVar3);
    newtext = (char *)fopen(__filename,"w");
  }
  if (newtext == (char *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    nonfatal("Unable to store host key: open(\"%s\") returned \'%s\'",__filename,pcVar3);
    safefree(__filename);
  }
  else {
    pcVar3 = make_filename(1,(char *)0x0);
    __stream = fopen(pcVar3,"r");
    pcVar4 = dupprintf("%s@%d:%s %s\n",keytype,(ulong)(uint)port,hostname,key);
    sVar5 = strcspn(pcVar4," ");
    if (__stream != (FILE *)0x0) {
      while (pcVar6 = fgetline((FILE *)__stream), pcVar6 != (char *)0x0) {
        iVar1 = strncmp(pcVar6,pcVar4,(long)((int)sVar5 + 1));
        if (iVar1 != 0) {
          fputs(pcVar6,(FILE *)newtext);
        }
        safefree(pcVar6);
      }
      fclose(__stream);
    }
    fputs(pcVar4,(FILE *)newtext);
    fclose((FILE *)newtext);
    iVar1 = rename(__filename,pcVar3);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      pcVar6 = strerror(*piVar2);
      nonfatal("Unable to store host key: rename(\"%s\",\"%s\") returned \'%s\'",__filename,pcVar3,
               pcVar6);
    }
    safefree(__filename);
    safefree(pcVar3);
    safefree(pcVar4);
  }
  return;
}

Assistant:

void store_host_key(const char *hostname, int port,
                    const char *keytype, const char *key)
{
    FILE *rfp, *wfp;
    char *newtext, *line;
    int headerlen;
    char *filename, *tmpfilename;

    /*
     * Open both the old file and a new file.
     */
    tmpfilename = make_filename(INDEX_HOSTKEYS_TMP, NULL);
    wfp = fopen(tmpfilename, "w");
    if (!wfp && errno == ENOENT) {
        char *dir, *errmsg;

        dir = make_filename(INDEX_DIR, NULL);
        if ((errmsg = make_dir_path(dir, 0700)) != NULL) {
            nonfatal("Unable to store host key: %s", errmsg);
            sfree(errmsg);
            sfree(dir);
            sfree(tmpfilename);
            return;
        }
        sfree(dir);

        wfp = fopen(tmpfilename, "w");
    }
    if (!wfp) {
        nonfatal("Unable to store host key: open(\"%s\") "
                 "returned '%s'", tmpfilename, strerror(errno));
        sfree(tmpfilename);
        return;
    }
    filename = make_filename(INDEX_HOSTKEYS, NULL);
    rfp = fopen(filename, "r");

    newtext = dupprintf("%s@%d:%s %s\n", keytype, port, hostname, key);
    headerlen = 1 + strcspn(newtext, " ");   /* count the space too */

    /*
     * Copy all lines from the old file to the new one that _don't_
     * involve the same host key identifier as the one we're adding.
     */
    if (rfp) {
        while ( (line = fgetline(rfp)) ) {
            if (strncmp(line, newtext, headerlen))
                fputs(line, wfp);
            sfree(line);
        }
        fclose(rfp);
    }

    /*
     * Now add the new line at the end.
     */
    fputs(newtext, wfp);

    fclose(wfp);

    if (rename(tmpfilename, filename) < 0) {
        nonfatal("Unable to store host key: rename(\"%s\",\"%s\")"
                 " returned '%s'", tmpfilename, filename,
                 strerror(errno));
    }

    sfree(tmpfilename);
    sfree(filename);
    sfree(newtext);
}